

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

Read<signed_char> __thiscall Omega_h::get_comps_are_fixed(Omega_h *this,Mesh *mesh)

{
  Mesh *pMVar1;
  bool bVar2;
  LO size_in;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar3;
  Read<signed_char> RVar4;
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  Mesh *local_18;
  Mesh *mesh_local;
  
  local_18 = mesh;
  mesh_local = (Mesh *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"momentum_velocity_fixed",&local_39);
  bVar2 = Mesh::has_tag(mesh,0,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pMVar1 = local_18;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"momentum_velocity_fixed",&local_71);
    Mesh::get_array<signed_char>((Mesh *)this,(Int)pMVar1,(string *)0x0);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    pvVar3 = extraout_RDX;
  }
  else {
    size_in = Mesh::nverts(local_18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"",&local_99);
    Read<signed_char>::Read((Read<signed_char> *)this,size_in,'\0',(string *)local_98);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    pvVar3 = extraout_RDX_00;
  }
  RVar4.write_.shared_alloc_.direct_ptr = pvVar3;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar4.write_.shared_alloc_;
}

Assistant:

static Read<I8> get_comps_are_fixed(Mesh* mesh) {
  if (mesh->has_tag(VERT, "momentum_velocity_fixed")) {
    return mesh->get_array<I8>(VERT, "momentum_velocity_fixed");
  } else {
    return Read<I8>(mesh->nverts(), I8(0));
  }
}